

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O2

void __thiscall DWallLightTransfer::Serialize(DWallLightTransfer *this,FSerializer *arc)

{
  FSerializer *pFVar1;
  
  DObject::Serialize((DObject *)this,arc);
  pFVar1 = FSerializer::operator()(arc,"lastlight",&this->LastLight);
  pFVar1 = FSerializer::operator()(pFVar1,"source",&this->Source);
  pFVar1 = FSerializer::operator()(pFVar1,"targetid",&this->TargetID);
  FSerializer::operator()(pFVar1,"flags",&this->Flags);
  return;
}

Assistant:

void DWallLightTransfer::Serialize(FSerializer &arc)
{
	Super::Serialize (arc);
	arc("lastlight", LastLight)
		("source", Source)
		("targetid", TargetID)
		("flags", Flags);
}